

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O2

bool __thiscall
duckdb::FlattenDependentJoins::DetectCorrelatedExpressions
          (FlattenDependentJoins *this,LogicalOperator *op,bool lateral,idx_t lateral_depth,
          bool parent_is_dependent_join)

{
  LogicalOperatorType LVar1;
  mapped_type pLVar2;
  bool bVar3;
  type op_00;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *ppLVar6;
  reference pvVar7;
  byte bVar8;
  int iVar9;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this_00;
  idx_t lateral_depth_00;
  key_type local_78;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *local_70;
  mapped_type local_68;
  idx_t local_60;
  pointer local_58;
  HasCorrelatedExpressions visitor;
  
  LVar1 = op->type;
  local_60 = lateral_depth;
  HasCorrelatedExpressions::HasCorrelatedExpressions
            (&visitor,this->correlated_columns,lateral,lateral_depth);
  LogicalOperatorVisitor::VisitOperatorExpressions(&visitor.super_LogicalOperatorVisitor,op);
  local_70 = &op->children;
  local_58 = (op->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  iVar9 = 0;
  local_68 = op;
  bVar8 = visitor.has_correlated_expressions;
  for (this_00 = (op->children).
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pLVar2 = local_68, this_00 != local_58;
      this_00 = this_00 + 1) {
    lateral_depth_00 = (iVar9 == 1 && LVar1 == LOGICAL_DEPENDENT_JOIN) + local_60;
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    bVar3 = DetectCorrelatedExpressions
                      (this,op_00,lateral,lateral_depth_00,
                       iVar9 == 0 && (LVar1 == LOGICAL_DEPENDENT_JOIN || parent_is_dependent_join));
    if (bVar3) {
      bVar8 = 1;
    }
    iVar9 = iVar9 + 1;
  }
  if (local_68->type == LOGICAL_CTE_REF) {
    local_78._M_data = local_68;
    iVar4 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->has_correlated_expressions)._M_h,&local_78);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_true>
        ._M_cur != (__node_type *)0x0) goto LAB_00a67828;
    local_78._M_data = pLVar2;
    pmVar5 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->has_correlated_expressions,&local_78);
    *pmVar5 = false;
  }
  else {
LAB_00a67828:
    local_78._M_data = pLVar2;
    pmVar5 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->has_correlated_expressions,&local_78);
    *pmVar5 = (mapped_type)(bVar8 & 1);
    if ((pLVar2->type & (LOGICAL_CREATE_SEQUENCE|LOGICAL_CREATE_TABLE)) != LOGICAL_RECURSIVE_CTE)
    goto LAB_00a678b1;
    ppLVar6 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->binder->recursive_ctes,
                           (key_type *)
                           &pLVar2[1].children.
                            super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *ppLVar6 = pLVar2;
    if ((bVar8 & 1) == 0) {
      bVar8 = 0;
      goto LAB_00a678b1;
    }
    ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
    operator=((vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> *
              )&pLVar2[1].expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
              &this->correlated_columns->
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             );
    pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(local_70,1);
    MarkSubtreeCorrelated
              (this,(pvVar7->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  }
  bVar8 = 1;
LAB_00a678b1:
  return (bool)(bVar8 & 1);
}

Assistant:

bool FlattenDependentJoins::DetectCorrelatedExpressions(LogicalOperator &op, bool lateral, idx_t lateral_depth,
                                                        bool parent_is_dependent_join) {

	bool is_lateral_join = false;

	// check if this entry has correlated expressions
	if (op.type == LogicalOperatorType::LOGICAL_DEPENDENT_JOIN) {
		is_lateral_join = true;
	}
	HasCorrelatedExpressions visitor(correlated_columns, lateral, lateral_depth);
	visitor.VisitOperator(op);
	bool has_correlation = visitor.has_correlated_expressions;
	int child_idx = 0;
	// now visit the children of this entry and check if they have correlated expressions
	for (auto &child : op.children) {
		auto new_lateral_depth = lateral_depth;
		if (is_lateral_join && child_idx == 1) {
			new_lateral_depth = lateral_depth + 1;
		}
		// we OR the property with its children such that has_correlation is true if either
		// (1) this node has a correlated expression or
		// (2) one of its children has a correlated expression
		bool condition = (parent_is_dependent_join || is_lateral_join) && child_idx == 0;
		if (DetectCorrelatedExpressions(*child, lateral, new_lateral_depth, condition)) {
			has_correlation = true;
		}
		child_idx++;
	}

	// We found a CTE reference
	if (op.type == LogicalOperatorType::LOGICAL_CTE_REF) {
		// Check, if the operator already has an entry in has_correlated_expressions.
		// This would only be the case, if we hit MarkSubtreeCorrelated previously.
		auto entry = has_correlated_expressions.find(op);

		if (entry == has_correlated_expressions.end()) {
			has_correlated_expressions[op] = false;
			return true;
		}
	}

	// set the entry in the map
	has_correlated_expressions[op] = has_correlation;

	// If we detect correlation in a materialized or recursive CTE, the entire right side of the operator
	// needs to be marked as correlated. Otherwise, function PushDownDependentJoinInternal does not do the
	// right thing.
	if (op.type == LogicalOperatorType::LOGICAL_MATERIALIZED_CTE ||
	    op.type == LogicalOperatorType::LOGICAL_RECURSIVE_CTE) {
		auto &setop = op.Cast<LogicalCTE>();
		binder.recursive_ctes[setop.table_index] = &setop;
		if (has_correlation) {
			setop.correlated_columns = correlated_columns;
			MarkSubtreeCorrelated(*op.children[1].get());
		}
	}
	return has_correlation;
}